

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Of(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Jf_Par_t Pars;
  char Buffer [200];
  Jf_Par_t local_200;
  char local_f8 [200];
  
  Of_ManSetDefaultPars(&local_200);
  Extra_UtilGetoptReset();
LAB_002863ec:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDNMQekmpgtvwh");
  iVar6 = globalUtilOptind;
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRoundsEla = uVar2;
    break;
  case 0x42:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4f:
  case 0x50:
    goto switchD_00286409_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    local_200.nCutNum = uVar2;
    if (((int)uVar2 < 1) || (local_200.nCutNumMax < (int)uVar2)) {
      pcVar5 = "This number of cuts (%d) is not supported.\n";
      goto LAB_00286985;
    }
    goto LAB_002863ec;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-D\" should be followed by a floating point number.\n";
LAB_002866b5:
      Abc_Print(-1,pcVar5);
      goto switchD_00286409_caseD_42;
    }
    local_200.DelayTarget = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if (local_200.DelayTarget < 1) goto LAB_002866c5;
    goto LAB_002863ec;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-E\" should be followed by a floating point number.\n";
      goto LAB_00286677;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nAreaTuner = uVar2;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRounds = uVar2;
    break;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-K\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    local_200.nLutSize = uVar2;
    if (((int)uVar2 < 2) || (local_200.nLutSizeMax < (int)uVar2)) {
      pcVar5 = "LUT size %d is not supported.\n";
LAB_00286985:
      globalUtilOptind = iVar6 + 1;
      Abc_Print(-1,pcVar5,(ulong)uVar2);
switchD_00286409_caseD_42:
LAB_002866c5:
      if (local_200.DelayTarget == 0xffffffff) {
        builtin_strncpy(local_f8 + 8,"sible",6);
        builtin_strncpy(local_f8,"best pos",8);
      }
      else {
        sprintf(local_f8,"%d",(ulong)(uint)local_200.DelayTarget);
      }
      Abc_Print(-2,"usage: &of [-KCFARLEDNMQ num] [-kmpgtvwh]\n");
      Abc_Print(-2,"\t           performs technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                (ulong)(uint)local_200.nLutSizeMax,(ulong)(uint)local_200.nLutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                (ulong)(uint)local_200.nCutNumMax,(ulong)(uint)local_200.nCutNum);
      Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
                (ulong)(uint)local_200.nRounds);
      Abc_Print(-2,"\t-A num   : the number of exact area rounds [default = %d]\n",
                (ulong)(uint)local_200.nRoundsEla);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)local_200.nRelaxRatio);
      Abc_Print(-2,
                "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
                (ulong)(uint)local_200.nCoarseLimit);
      Abc_Print(-2,
                "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
                (ulong)(uint)local_200.nAreaTuner);
      Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                local_f8);
      Abc_Print(-2,"\t-N num   : delay of the first LUT [default = %d]\n",
                (ulong)(uint)local_200.nDelayLut1);
      Abc_Print(-2,"\t-M num   : delay of the second LUT [default = %d]\n",
                (ulong)(uint)local_200.nDelayLut2);
      Abc_Print(-2,"\t-Q num   : the number of fast non-routable edges [default = %d]\n",
                (ulong)(uint)local_200.nFastEdges);
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (local_200.fOptEdge == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_200.fCoarsen == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_200.fCutMin == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_200.fPower == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-p       : toggles power-aware cut selection heuristics [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_200.fPureAig == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_200.fDoAverage == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_200.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar5);
      if (local_200.fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar4);
      pcVar5 = "\t-h       : prints the command usage\n";
      iVar6 = -2;
LAB_00286955:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
    goto LAB_002863ec;
  case 0x4c:
    if (argc <= globalUtilOptind) {
LAB_00286615:
      pcVar5 = "Command line switch \"-R\" should be followed by a floating point number.\n";
LAB_00286677:
      Abc_Print(1,pcVar5);
      return 0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nCoarseLimit = uVar2;
    break;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-M\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nDelayLut2 = uVar2;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-N\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nDelayLut1 = uVar2;
    break;
  case 0x51:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-Q\" should be followed by a positive integer.\n";
      goto LAB_002866b5;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nFastEdges = uVar2;
    break;
  case 0x52:
    if (argc <= globalUtilOptind) goto LAB_00286615;
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRelaxRatio = uVar2;
    break;
  default:
    switch(iVar1) {
    case 0x65:
      local_200.fOptEdge = local_200.fOptEdge ^ 1;
      break;
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
      goto switchD_00286409_caseD_42;
    case 0x67:
      local_200.fPureAig = local_200.fPureAig ^ 1;
      break;
    case 0x6b:
      local_200.fCoarsen = local_200.fCoarsen ^ 1;
      break;
    case 0x6d:
      local_200.fCutMin = local_200.fCutMin ^ 1;
      break;
    case 0x70:
      local_200.fPower = local_200.fPower ^ 1;
      break;
    case 0x74:
      local_200.fDoAverage = local_200.fDoAverage ^ 1;
      break;
    case 0x76:
      local_200.fVerbose = local_200.fVerbose ^ 1;
      break;
    case 0x77:
      local_200.fVeryVerbose = local_200.fVeryVerbose ^ 1;
      break;
    default:
      if (iVar1 != -1) goto switchD_00286409_caseD_42;
      pGVar3 = pAbc->pGia;
      if (pGVar3 == (Gia_Man_t *)0x0) {
        pcVar5 = "Empty GIA network.\n";
      }
      else if (pGVar3->vMapping == (Vec_Int_t *)0x0) {
        pGVar3 = Of_ManPerformMapping(pGVar3,&local_200);
        if (pGVar3 != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,pGVar3);
          return 0;
        }
        pcVar5 = "Abc_CommandAbc9Of(): Mapping into LUTs has failed.\n";
      }
      else {
        pcVar5 = "Current AIG has mapping. Run \"&st\".\n";
      }
      iVar6 = -1;
      goto LAB_00286955;
    }
    goto LAB_002863ec;
  }
  globalUtilOptind = iVar6 + 1;
  if ((int)uVar2 < 0) goto switchD_00286409_caseD_42;
  goto LAB_002863ec;
}

Assistant:

int Abc_CommandAbc9Of( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Of_ManSetDefaultPars( Jf_Par_t * pPars );
    extern Gia_Man_t * Of_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Of_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDNMQekmpgtvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDelayLut1 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDelayLut1 < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDelayLut2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDelayLut2 < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFastEdges = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFastEdges < 0 )
                goto usage;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has mapping. Run \"&st\".\n" );
        return 1;
    }

    pNew = Of_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Of(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &of [-KCFARLEDNMQ num] [-kmpgtvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds [default = %d]\n", pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n", pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n", pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-N num   : delay of the first LUT [default = %d]\n", pPars->nDelayLut1 );
    Abc_Print( -2, "\t-M num   : delay of the second LUT [default = %d]\n", pPars->nDelayLut2 );
    Abc_Print( -2, "\t-Q num   : the number of fast non-routable edges [default = %d]\n", pPars->nFastEdges );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}